

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockTime.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,ClockTime *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Hour:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i32Hour);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Time Past Hour:   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString ClockTime::GetAsString() const
{
    KStringStream ss;

    ss << "Hour:             " << m_i32Hour          << "\n"
       << "Time Past Hour:   " << m_ui32TimePastHour << "\n";

    return ss.str();
}